

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampleMOD.cpp
# Opt level: O0

void __thiscall
WDL_Resampler::WDL_Resampler_Filter::setParms
          (WDL_Resampler_Filter *this,double fpos,double fpos2,double Q,int hist_sz,int nch)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  double local_80;
  double sc;
  double alpha;
  double spos;
  double cpos;
  double pos;
  double *p;
  int oldsz;
  int nch_local;
  int hist_sz_local;
  double Q_local;
  double fpos2_local;
  double fpos_local;
  WDL_Resampler_Filter *this_local;
  
  if (1.0 <= fpos) {
    fpos2_local = 1.0;
  }
  else {
    if ((this->m_state == -1) && (0.97 <= fpos)) {
      this->m_state = 0;
    }
    fpos2_local = fpos2 * fpos;
  }
  this->m_filtsz = hist_sz;
  iVar5 = nch * 4 * hist_sz;
  iVar6 = WDL_TypedBuf<double>::GetSize(&this->m_hist);
  if (iVar6 != iVar5) {
    iVar6 = WDL_TypedBuf<double>::GetSize(&this->m_hist);
    pdVar7 = WDL_TypedBuf<double>::Resize(&this->m_hist,iVar5,false);
    iVar5 = WDL_TypedBuf<double>::GetSize(&this->m_hist);
    if (iVar6 < iVar5) {
      iVar5 = WDL_TypedBuf<double>::GetSize(&this->m_hist);
      memset(pdVar7 + iVar6,0,(long)(iVar5 - iVar6) << 3);
    }
  }
  if (1e-06 <= ABS(fpos2_local - this->m_fpos)) {
    this->m_fpos = fpos2_local;
    if ((fpos2_local != 1.0) || (local_80 = fpos2, NAN(fpos2_local))) {
      local_80 = fpos2_local;
    }
    dVar1 = cos(local_80 * 3.141592653589793);
    dVar2 = sin(local_80 * 3.141592653589793);
    dVar2 = dVar2 / (Q * 2.0);
    dVar3 = 1.0 / (dVar2 + 1.0);
    this->m_b1 = (1.0 - dVar1) * dVar3;
    dVar4 = this->m_b1 * 0.5;
    this->m_b0 = dVar4;
    this->m_b2 = dVar4;
    this->m_a1 = dVar1 * -2.0 * dVar3;
    this->m_a2 = (1.0 - dVar2) * dVar3;
  }
  return;
}

Assistant:

void setParms(double fpos, double fpos2, double Q, int hist_sz, int nch)
  {
    if (fpos < 1.0)
    {
       // if initial filter state is close to nyquist, fade-in
       // (in case this resampler was newly activated on varispeed media)
      if (m_state == -1 && fpos >= 0.97) m_state=0;
      fpos *= fpos2;
    }
    else
    {
      fpos = 1.0;
    }

    m_filtsz = hist_sz;
    hist_sz *= 4 * nch;
    if (m_hist.GetSize() != hist_sz)
    {
      const int oldsz = m_hist.GetSize();
      double *p = m_hist.Resize(hist_sz,false);
      if (m_hist.GetSize() > oldsz)
        memset(p+oldsz,0,(m_hist.GetSize() - oldsz)*sizeof(double));
    }

    if (fabs(fpos-m_fpos)<0.000001) return;
    m_fpos=fpos;

    const double pos = (fpos == 1.0 ? fpos2 : fpos) * PI;
    const double cpos=cos(pos);
    const double spos=sin(pos);
    const double alpha=spos/(2.0*Q);
    const double sc=1.0/( 1 + alpha);
    m_b1 = (1-cpos) * sc;
    m_b2 = m_b0 = m_b1*0.5;
    m_a1 =  -2 * cpos * sc;
    m_a2 = (1-alpha)*sc;
  }